

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O0

string * gutil::anon_unknown_3::getValue(string *s)

{
  ulong uVar1;
  ulong uVar2;
  string *in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  size_t pos;
  string *ret;
  string local_40 [32];
  ulong local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string(in_RDI,in_RSI);
  uVar1 = std::__cxx11::string::find((char)in_RDI,0x23);
  local_20 = uVar1;
  uVar2 = std::__cxx11::string::size();
  if (uVar1 < uVar2) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
  }
  trim(unaff_retaddr);
  return in_RDI;
}

Assistant:

std::string getValue(const std::string &s)
{
  std::string ret=s;
  size_t pos=ret.find('#');

  if (pos < ret.size())
  {
    ret=ret.substr(0, pos);
  }

  trim(ret);

  return ret;
}